

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_layout_mapping_right_basics.cpp
# Opt level: O2

void test_3d_dynamic<15ul,30ul,30ul>(void)

{
  _Head_base<0UL,_int,_false> _Var1;
  _Head_base<2UL,_int,_false> _Var2;
  _Head_base<1UL,_int,_false> _Var3;
  pointer ptVar4;
  value_type vVar5;
  value_type vVar6;
  value_type vVar7;
  size_type sVar8;
  reference pvVar9;
  int iVar10;
  ulong uVar11;
  long lVar12;
  _Head_base<0UL,_int,_false> local_94;
  _Head_base<2UL,_int,_false> local_90;
  _Head_base<1UL,_int,_false> local_8c;
  value_type true_idx;
  value_type local_80;
  tuple<int,_int,_int> *local_78;
  vector<std::tuple<int,_int,_int>,_std::allocator<std::tuple<int,_int,_int>_>_> data;
  pointer local_58;
  undefined8 local_50;
  undefined8 local_48;
  undefined8 local_40;
  
  local_50 = 0xf;
  local_48 = 0x1e;
  local_40 = 0x1e;
  data.super__Vector_base<std::tuple<int,_int,_int>,_std::allocator<std::tuple<int,_int,_int>_>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT71(data.
                         super__Vector_base<std::tuple<int,_int,_int>,_std::allocator<std::tuple<int,_int,_int>_>_>
                         ._M_impl.super__Vector_impl_data._M_start._1_7_,1);
  true_idx = CONCAT71(true_idx._1_7_,1);
  boost::detail::test_eq_impl<bool,bool>
            ("(l.is_regular())","true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_basics.cpp"
             ,0xf5,"void test_3d_dynamic() [X = 15UL, Y = 30UL, Z = 30UL]",(bool *)&data,
             (bool *)&true_idx);
  data.super__Vector_base<std::tuple<int,_int,_int>,_std::allocator<std::tuple<int,_int,_int>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x1;
  true_idx = CONCAT44(true_idx._4_4_,1);
  boost::detail::test_eq_impl<unsigned_long,int>
            ("(l.stride(0))","1",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_basics.cpp"
             ,0xf7,"void test_3d_dynamic() [X = 15UL, Y = 30UL, Z = 30UL]",(unsigned_long *)&data,
             (int *)&true_idx);
  data.super__Vector_base<std::tuple<int,_int,_int>,_std::allocator<std::tuple<int,_int,_int>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x1;
  true_idx = CONCAT44(true_idx._4_4_,1);
  boost::detail::test_eq_impl<unsigned_long,int>
            ("(l.stride(1))","1",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_basics.cpp"
             ,0xf8,"void test_3d_dynamic() [X = 15UL, Y = 30UL, Z = 30UL]",(unsigned_long *)&data,
             (int *)&true_idx);
  data.super__Vector_base<std::tuple<int,_int,_int>,_std::allocator<std::tuple<int,_int,_int>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x1;
  true_idx = CONCAT44(true_idx._4_4_,1);
  boost::detail::test_eq_impl<unsigned_long,int>
            ("(l.stride(2))","1",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_basics.cpp"
             ,0xf9,"void test_3d_dynamic() [X = 15UL, Y = 30UL, Z = 30UL]",(unsigned_long *)&data,
             (int *)&true_idx);
  data.super__Vector_base<std::tuple<int,_int,_int>,_std::allocator<std::tuple<int,_int,_int>_>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (pointer)std::experimental::
                dimensions<18446744073709551615UL,_18446744073709551615UL,_18446744073709551615UL>::
                size((dimensions<18446744073709551615UL,_18446744073709551615UL,_18446744073709551615UL>
                      *)&local_50);
  iVar10 = 0;
  local_80 = std::experimental::
             dimensions<18446744073709551615UL,_18446744073709551615UL,_18446744073709551615UL>::
             operator[]<int>((dimensions<18446744073709551615UL,_18446744073709551615UL,_18446744073709551615UL>
                              *)&local_50,0);
  vVar5 = std::experimental::
          dimensions<18446744073709551615UL,_18446744073709551615UL,_18446744073709551615UL>::
          operator[]<int>((dimensions<18446744073709551615UL,_18446744073709551615UL,_18446744073709551615UL>
                           *)&local_50,1);
  lVar12 = vVar5 * local_80;
  vVar5 = std::experimental::
          dimensions<18446744073709551615UL,_18446744073709551615UL,_18446744073709551615UL>::
          operator[]<int>((dimensions<18446744073709551615UL,_18446744073709551615UL,_18446744073709551615UL>
                           *)&local_50,2);
  true_idx = vVar5 * lVar12;
  boost::detail::test_eq_impl<unsigned_long,unsigned_long>
            ("(l.size())","l[0] * l[1] * l[2]",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_basics.cpp"
             ,0xfb,"void test_3d_dynamic() [X = 15UL, Y = 30UL, Z = 30UL]",(unsigned_long *)&data,
             &true_idx);
  data.super__Vector_base<std::tuple<int,_int,_int>,_std::allocator<std::tuple<int,_int,_int>_>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (pointer)std::experimental::
                layout_mapping_right<std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL,_18446744073709551615UL>,_std::experimental::dimensions<1UL,_1UL,_1UL>,_std::experimental::dimensions<0UL,_0UL,_0UL>_>
                ::span((layout_mapping_right<std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL,_18446744073709551615UL>,_std::experimental::dimensions<1UL,_1UL,_1UL>,_std::experimental::dimensions<0UL,_0UL,_0UL>_>
                        *)&local_50);
  local_80 = std::experimental::
             dimensions<18446744073709551615UL,_18446744073709551615UL,_18446744073709551615UL>::
             operator[]<int>((dimensions<18446744073709551615UL,_18446744073709551615UL,_18446744073709551615UL>
                              *)&local_50,0);
  vVar5 = std::experimental::
          dimensions<18446744073709551615UL,_18446744073709551615UL,_18446744073709551615UL>::
          operator[]<int>((dimensions<18446744073709551615UL,_18446744073709551615UL,_18446744073709551615UL>
                           *)&local_50,1);
  lVar12 = vVar5 * local_80;
  vVar5 = std::experimental::
          dimensions<18446744073709551615UL,_18446744073709551615UL,_18446744073709551615UL>::
          operator[]<int>((dimensions<18446744073709551615UL,_18446744073709551615UL,_18446744073709551615UL>
                           *)&local_50,2);
  true_idx = vVar5 * lVar12;
  boost::detail::test_eq_impl<unsigned_long,unsigned_long>
            ("(l.span())","l[0] * l[1] * l[2]",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_basics.cpp"
             ,0xfc,"void test_3d_dynamic() [X = 15UL, Y = 30UL, Z = 30UL]",(unsigned_long *)&data,
             &true_idx);
  vVar5 = std::experimental::
          dimensions<18446744073709551615UL,_18446744073709551615UL,_18446744073709551615UL>::
          operator[]<int>((dimensions<18446744073709551615UL,_18446744073709551615UL,_18446744073709551615UL>
                           *)&local_50,0);
  vVar6 = std::experimental::
          dimensions<18446744073709551615UL,_18446744073709551615UL,_18446744073709551615UL>::
          operator[]<int>((dimensions<18446744073709551615UL,_18446744073709551615UL,_18446744073709551615UL>
                           *)&local_50,1);
  vVar7 = std::experimental::
          dimensions<18446744073709551615UL,_18446744073709551615UL,_18446744073709551615UL>::
          operator[]<int>((dimensions<18446744073709551615UL,_18446744073709551615UL,_18446744073709551615UL>
                           *)&local_50,2);
  std::vector<std::tuple<int,_int,_int>,_std::allocator<std::tuple<int,_int,_int>_>_>::vector
            (&data,vVar5 * vVar6 * vVar7,(allocator_type *)&true_idx);
  ptVar4 = data.
           super__Vector_base<std::tuple<int,_int,_int>,_std::allocator<std::tuple<int,_int,_int>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  while( true ) {
    local_90._M_head_impl = iVar10;
    vVar5 = std::experimental::
            dimensions<18446744073709551615UL,_18446744073709551615UL,_18446744073709551615UL>::
            operator[]<int>((dimensions<18446744073709551615UL,_18446744073709551615UL,_18446744073709551615UL>
                             *)&local_50,2);
    if (vVar5 <= (ulong)(long)iVar10) break;
    local_8c._M_head_impl = 0;
    while( true ) {
      uVar11 = (ulong)local_8c._M_head_impl;
      vVar5 = std::experimental::
              dimensions<18446744073709551615UL,_18446744073709551615UL,_18446744073709551615UL>::
              operator[]<int>((dimensions<18446744073709551615UL,_18446744073709551615UL,_18446744073709551615UL>
                               *)&local_50,1);
      if (vVar5 <= uVar11) break;
      local_94._M_head_impl = 0;
      while( true ) {
        uVar11 = (ulong)local_94._M_head_impl;
        vVar5 = std::experimental::
                dimensions<18446744073709551615UL,_18446744073709551615UL,_18446744073709551615UL>::
                operator[]<int>((dimensions<18446744073709551615UL,_18446744073709551615UL,_18446744073709551615UL>
                                 *)&local_50,0);
        if (vVar5 <= uVar11) break;
        vVar5 = std::experimental::
                dimensions<18446744073709551615UL,_18446744073709551615UL,_18446744073709551615UL>::
                operator[]<int>((dimensions<18446744073709551615UL,_18446744073709551615UL,_18446744073709551615UL>
                                 *)&local_50,1);
        vVar6 = std::experimental::
                dimensions<18446744073709551615UL,_18446744073709551615UL,_18446744073709551615UL>::
                operator[]<int>((dimensions<18446744073709551615UL,_18446744073709551615UL,_18446744073709551615UL>
                                 *)&local_50,2);
        lVar12 = (long)local_94._M_head_impl;
        vVar7 = std::experimental::
                dimensions<18446744073709551615UL,_18446744073709551615UL,_18446744073709551615UL>::
                operator[]<int>((dimensions<18446744073709551615UL,_18446744073709551615UL,_18446744073709551615UL>
                                 *)&local_50,2);
        true_idx = vVar7 * (long)local_8c._M_head_impl + lVar12 * vVar6 * vVar5 +
                   (long)local_90._M_head_impl;
        local_78 = (tuple<int,_int,_int> *)
                   std::experimental::
                   layout_mapping_right<std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<1ul,1ul,1ul>,std::experimental::dimensions<0ul,0ul,0ul>>
                   ::index<int,int,int>
                             ((layout_mapping_right<std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<1ul,1ul,1ul>,std::experimental::dimensions<0ul,0ul,0ul>>
                               *)&local_50,local_94._M_head_impl,local_8c._M_head_impl,
                              local_90._M_head_impl);
        boost::detail::test_eq_impl<unsigned_long,unsigned_long>
                  ("(l.index(i, j, k))","true_idx",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_basics.cpp"
                   ,0x108,"void test_3d_dynamic() [X = 15UL, Y = 30UL, Z = 30UL]",
                   (unsigned_long *)&local_78,&true_idx);
        sVar8 = std::experimental::
                layout_mapping_right<std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<1ul,1ul,1ul>,std::experimental::dimensions<0ul,0ul,0ul>>
                ::index<int,int,int>
                          ((layout_mapping_right<std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<1ul,1ul,1ul>,std::experimental::dimensions<0ul,0ul,0ul>>
                            *)&local_50,local_94._M_head_impl,local_8c._M_head_impl,
                           local_90._M_head_impl);
        local_78 = ptVar4 + sVar8;
        local_58 = ptVar4 + true_idx;
        boost::detail::test_eq_impl<std::tuple<int,int,int>*,std::tuple<int,int,int>*>
                  ("&(dptr[l.index(i, j, k)])","&(dptr[true_idx])",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_basics.cpp"
                   ,0x10a,"void test_3d_dynamic() [X = 15UL, Y = 30UL, Z = 30UL]",&local_78,
                   &local_58);
        _Var1._M_head_impl = local_94._M_head_impl;
        sVar8 = std::experimental::
                layout_mapping_right<std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<1ul,1ul,1ul>,std::experimental::dimensions<0ul,0ul,0ul>>
                ::index<int,int,int>
                          ((layout_mapping_right<std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<1ul,1ul,1ul>,std::experimental::dimensions<0ul,0ul,0ul>>
                            *)&local_50,local_94._M_head_impl,local_8c._M_head_impl,
                           local_90._M_head_impl);
        _Var3._M_head_impl = local_8c._M_head_impl;
        ptVar4[sVar8].super__Tuple_impl<0UL,_int,_int,_int>.super__Head_base<0UL,_int,_false>.
        _M_head_impl = _Var1._M_head_impl;
        sVar8 = std::experimental::
                layout_mapping_right<std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<1ul,1ul,1ul>,std::experimental::dimensions<0ul,0ul,0ul>>
                ::index<int,int,int>
                          ((layout_mapping_right<std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<1ul,1ul,1ul>,std::experimental::dimensions<0ul,0ul,0ul>>
                            *)&local_50,local_94._M_head_impl,local_8c._M_head_impl,
                           local_90._M_head_impl);
        _Var2._M_head_impl = local_90._M_head_impl;
        ptVar4[sVar8].super__Tuple_impl<0UL,_int,_int,_int>.super__Tuple_impl<1UL,_int,_int>.
        super__Head_base<1UL,_int,_false>._M_head_impl = _Var3._M_head_impl;
        sVar8 = std::experimental::
                layout_mapping_right<std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<1ul,1ul,1ul>,std::experimental::dimensions<0ul,0ul,0ul>>
                ::index<int,int,int>
                          ((layout_mapping_right<std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<1ul,1ul,1ul>,std::experimental::dimensions<0ul,0ul,0ul>>
                            *)&local_50,local_94._M_head_impl,local_8c._M_head_impl,
                           local_90._M_head_impl);
        ptVar4[sVar8].super__Tuple_impl<0UL,_int,_int,_int>.super__Tuple_impl<1UL,_int,_int>.
        super__Tuple_impl<2UL,_int>.super__Head_base<2UL,_int,_false>._M_head_impl =
             _Var2._M_head_impl;
        sVar8 = std::experimental::
                layout_mapping_right<std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<1ul,1ul,1ul>,std::experimental::dimensions<0ul,0ul,0ul>>
                ::index<int,int,int>
                          ((layout_mapping_right<std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<1ul,1ul,1ul>,std::experimental::dimensions<0ul,0ul,0ul>>
                            *)&local_50,local_94._M_head_impl,local_8c._M_head_impl,
                           local_90._M_head_impl);
        boost::detail::test_eq_impl<int,int>
                  ("(std::get<0>(dptr[l.index(i, j, k)]))","i",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_basics.cpp"
                   ,0x110,"void test_3d_dynamic() [X = 15UL, Y = 30UL, Z = 30UL]",
                   &ptVar4[sVar8].super__Tuple_impl<0UL,_int,_int,_int>.
                    super__Head_base<0UL,_int,_false>._M_head_impl,&local_94._M_head_impl);
        sVar8 = std::experimental::
                layout_mapping_right<std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<1ul,1ul,1ul>,std::experimental::dimensions<0ul,0ul,0ul>>
                ::index<int,int,int>
                          ((layout_mapping_right<std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<1ul,1ul,1ul>,std::experimental::dimensions<0ul,0ul,0ul>>
                            *)&local_50,local_94._M_head_impl,local_8c._M_head_impl,
                           local_90._M_head_impl);
        boost::detail::test_eq_impl<int,int>
                  ("(std::get<1>(dptr[l.index(i, j, k)]))","j",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_basics.cpp"
                   ,0x111,"void test_3d_dynamic() [X = 15UL, Y = 30UL, Z = 30UL]",
                   &ptVar4[sVar8].super__Tuple_impl<0UL,_int,_int,_int>.
                    super__Tuple_impl<1UL,_int,_int>.super__Head_base<1UL,_int,_false>._M_head_impl,
                   &local_8c._M_head_impl);
        sVar8 = std::experimental::
                layout_mapping_right<std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<1ul,1ul,1ul>,std::experimental::dimensions<0ul,0ul,0ul>>
                ::index<int,int,int>
                          ((layout_mapping_right<std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<1ul,1ul,1ul>,std::experimental::dimensions<0ul,0ul,0ul>>
                            *)&local_50,local_94._M_head_impl,local_8c._M_head_impl,
                           local_90._M_head_impl);
        boost::detail::test_eq_impl<int,int>
                  ("(std::get<2>(dptr[l.index(i, j, k)]))","k",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_basics.cpp"
                   ,0x112,"void test_3d_dynamic() [X = 15UL, Y = 30UL, Z = 30UL]",
                   (int *)(ptVar4 + sVar8),&local_90._M_head_impl);
        sVar8 = std::experimental::
                layout_mapping_right<std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<1ul,1ul,1ul>,std::experimental::dimensions<0ul,0ul,0ul>>
                ::index<int,int,int>
                          ((layout_mapping_right<std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<1ul,1ul,1ul>,std::experimental::dimensions<0ul,0ul,0ul>>
                            *)&local_50,local_94._M_head_impl,local_8c._M_head_impl,
                           local_90._M_head_impl);
        pvVar9 = std::vector<std::tuple<int,_int,_int>,_std::allocator<std::tuple<int,_int,_int>_>_>
                 ::at(&data,sVar8);
        boost::detail::test_eq_impl<int,int>
                  ("(std::get<0>(data.at(l.index(i, j, k))))","i",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_basics.cpp"
                   ,0x115,"void test_3d_dynamic() [X = 15UL, Y = 30UL, Z = 30UL]",
                   &(pvVar9->super__Tuple_impl<0UL,_int,_int,_int>).
                    super__Head_base<0UL,_int,_false>._M_head_impl,&local_94._M_head_impl);
        sVar8 = std::experimental::
                layout_mapping_right<std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<1ul,1ul,1ul>,std::experimental::dimensions<0ul,0ul,0ul>>
                ::index<int,int,int>
                          ((layout_mapping_right<std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<1ul,1ul,1ul>,std::experimental::dimensions<0ul,0ul,0ul>>
                            *)&local_50,local_94._M_head_impl,local_8c._M_head_impl,
                           local_90._M_head_impl);
        pvVar9 = std::vector<std::tuple<int,_int,_int>,_std::allocator<std::tuple<int,_int,_int>_>_>
                 ::at(&data,sVar8);
        boost::detail::test_eq_impl<int,int>
                  ("(std::get<1>(data.at(l.index(i, j, k))))","j",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_basics.cpp"
                   ,0x116,"void test_3d_dynamic() [X = 15UL, Y = 30UL, Z = 30UL]",
                   &(pvVar9->super__Tuple_impl<0UL,_int,_int,_int>).super__Tuple_impl<1UL,_int,_int>
                    .super__Head_base<1UL,_int,_false>._M_head_impl,&local_8c._M_head_impl);
        sVar8 = std::experimental::
                layout_mapping_right<std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<1ul,1ul,1ul>,std::experimental::dimensions<0ul,0ul,0ul>>
                ::index<int,int,int>
                          ((layout_mapping_right<std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<1ul,1ul,1ul>,std::experimental::dimensions<0ul,0ul,0ul>>
                            *)&local_50,local_94._M_head_impl,local_8c._M_head_impl,
                           local_90._M_head_impl);
        pvVar9 = std::vector<std::tuple<int,_int,_int>,_std::allocator<std::tuple<int,_int,_int>_>_>
                 ::at(&data,sVar8);
        boost::detail::test_eq_impl<int,int>
                  ("(std::get<2>(data.at(l.index(i, j, k))))","k",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_basics.cpp"
                   ,0x117,"void test_3d_dynamic() [X = 15UL, Y = 30UL, Z = 30UL]",(int *)pvVar9,
                   &local_90._M_head_impl);
        local_94._M_head_impl = local_94._M_head_impl + 1;
      }
      local_8c._M_head_impl = local_8c._M_head_impl + 1;
    }
    iVar10 = local_90._M_head_impl + 1;
  }
  std::_Vector_base<std::tuple<int,_int,_int>,_std::allocator<std::tuple<int,_int,_int>_>_>::
  ~_Vector_base(&data.
                 super__Vector_base<std::tuple<int,_int,_int>,_std::allocator<std::tuple<int,_int,_int>_>_>
               );
  return;
}

Assistant:

void test_3d_dynamic()
{ // {{{
    layout_mapping_right<
        dimensions<dyn, dyn, dyn>, dimensions<1, 1, 1>, dimensions<0, 0, 0>
    > const l{{X, Y, Z}};

    BOOST_TEST_EQ((l.is_regular()), true);

    BOOST_TEST_EQ((l.stride(0)), 1);
    BOOST_TEST_EQ((l.stride(1)), 1);
    BOOST_TEST_EQ((l.stride(2)), 1);

    BOOST_TEST_EQ((l.size()), l[0] * l[1] * l[2]);
    BOOST_TEST_EQ((l.span()), l[0] * l[1] * l[2]);

    vector<tuple<int, int, int> > data(l[0] * l[1] * l[2]);
    tuple<int, int, int>* dptr = data.data();

    // Set all elements to a unique value.
    for (auto k = 0; k < l[2]; ++k)
    for (auto j = 0; j < l[1]; ++j)
    for (auto i = 0; i < l[0]; ++i)
    {
        auto const true_idx = (l[1]) * (l[2]) * (i) + (l[2]) * (j) + (k);

        BOOST_TEST_EQ((l.index(i, j, k)), true_idx);

        BOOST_TEST_EQ(&(dptr[l.index(i, j, k)]), &(dptr[true_idx])); 

        std::get<0>(dptr[l.index(i, j, k)]) = i;
        std::get<1>(dptr[l.index(i, j, k)]) = j;
        std::get<2>(dptr[l.index(i, j, k)]) = k;

        BOOST_TEST_EQ((std::get<0>(dptr[l.index(i, j, k)])), i); 
        BOOST_TEST_EQ((std::get<1>(dptr[l.index(i, j, k)])), j); 
        BOOST_TEST_EQ((std::get<2>(dptr[l.index(i, j, k)])), k); 

        // Bounds-checking.
        BOOST_TEST_EQ((std::get<0>(data.at(l.index(i, j, k)))), i); 
        BOOST_TEST_EQ((std::get<1>(data.at(l.index(i, j, k)))), j); 
        BOOST_TEST_EQ((std::get<2>(data.at(l.index(i, j, k)))), k); 
    }
}